

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O2

Call * __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::Call::Arg<>
          (Call *__return_storage_ptr__,Call *this,string_view format)

{
  string_view format_00;
  string local_40;
  
  format_00._M_str = format._M_str;
  format_00._M_len = (size_t)format_00._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_(&local_40,(lts_20250127 *)format._M_len,format_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->args,
             &local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Call(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Call Arg(absl::string_view format, const SubArgs&... args) && {
    this->args.emplace_back(absl::Substitute(format, args...));
    return std::move(*this);
  }